

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void GetPopulationInfo(VP8LHistogram *histo,HistogramIndex index,uint32_t **population,int *length)

{
  int iVar1;
  int *in_RCX;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  switch(in_ESI) {
  case 0:
    *in_RDX = *in_RDI;
    iVar1 = VP8LHistogramNumCodes(*(int *)(in_RDI + 0x195));
    *in_RCX = iVar1;
    break;
  case 1:
    *in_RDX = in_RDI + 1;
    *in_RCX = 0x100;
    break;
  case 2:
    *in_RDX = in_RDI + 0x81;
    *in_RCX = 0x100;
    break;
  case 3:
    *in_RDX = in_RDI + 0x101;
    *in_RCX = 0x100;
    break;
  case 4:
    *in_RDX = in_RDI + 0x181;
    *in_RCX = 0x28;
  }
  return;
}

Assistant:

static WEBP_INLINE void GetPopulationInfo(const VP8LHistogram* const histo,
                                          HistogramIndex index,
                                          const uint32_t** population,
                                          int* length) {
  switch (index) {
    case LITERAL:
      *population = histo->literal;
      *length = VP8LHistogramNumCodes(histo->palette_code_bits);
      break;
    case RED:
      *population = histo->red;
      *length = NUM_LITERAL_CODES;
      break;
    case BLUE:
      *population = histo->blue;
      *length = NUM_LITERAL_CODES;
      break;
    case ALPHA:
      *population = histo->alpha;
      *length = NUM_LITERAL_CODES;
      break;
    case DISTANCE:
      *population = histo->distance;
      *length = NUM_DISTANCE_CODES;
      break;
  }
}